

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O0

void initial_load_test_incremental_prefix(void)

{
  int iVar1;
  list_elem *plVar2;
  filemgr_open_result fVar3;
  initial_load_elem *ile_1;
  list_elem *le;
  uint8_t valuebuf [8];
  size_t ii_1;
  initial_load_elem *ile;
  size_t ii;
  list entries;
  hbtrie trie;
  btreeblk_handle bhandle;
  docio_handle dhandle;
  filemgr *file;
  filemgr_open_result result;
  filemgr_config config;
  docio_object doc;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  int rr;
  hbtrie_result r;
  char body [256];
  char meta [256];
  char dockey [256];
  uint32_t docsize;
  uint64_t _offset;
  uint64_t offset;
  int blocksize;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  docio_object *in_stack_fffffffffffff6f8;
  docio_handle *in_stack_fffffffffffff700;
  err_log_callback *log_callback;
  filemgr *in_stack_fffffffffffff708;
  code *handle;
  filemgr *in_stack_fffffffffffff710;
  filemgr *file_00;
  docio_handle *in_stack_fffffffffffff718;
  int in_stack_fffffffffffff738;
  hbtrie *in_stack_fffffffffffff740;
  list_elem *local_8b8;
  btree_blk_ops *in_stack_fffffffffffff750;
  void *in_stack_fffffffffffff758;
  list_elem *in_stack_fffffffffffff760;
  ulong uVar4;
  list_elem *in_stack_fffffffffffff770;
  list_elem *in_stack_fffffffffffff778;
  hbtrie_load_btreeblk_end *in_stack_fffffffffffff780;
  void *in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff807;
  docio_object *in_stack_fffffffffffff808;
  uint64_t in_stack_fffffffffffff810;
  docio_handle *in_stack_fffffffffffff818;
  err_log_callback local_798 [2];
  filemgr *local_758;
  filemgr *local_750;
  int local_748;
  int local_740 [4];
  undefined1 local_730;
  undefined2 local_720;
  ushort local_6e0;
  ushort local_6de;
  uint local_6dc;
  undefined1 *local_6c8;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  undefined1 local_6a8 [256];
  undefined1 local_5a8 [96];
  err_log_callback *in_stack_fffffffffffffab8;
  filemgr_config *in_stack_fffffffffffffac0;
  filemgr_ops *in_stack_fffffffffffffac8;
  char *in_stack_fffffffffffffad0;
  undefined1 local_4a8 [264];
  int local_3a0;
  hbtrie_result local_39c;
  char local_398 [216];
  err_log_callback *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd57;
  filemgr *in_stack_fffffffffffffd58;
  char local_298 [256];
  char local_198 [268];
  uint32_t local_8c;
  list_elem *local_88;
  bid_t local_80;
  int local_74;
  __time_t local_50;
  __suseconds_t local_48;
  timeval local_30;
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  local_50 = local_30.tv_sec;
  local_48 = local_30.tv_usec;
  local_74 = 0x1000;
  local_3a0 = system("rm -rf  hbtrie_testfile");
  docio_object::docio_object((docio_object *)in_stack_fffffffffffff700);
  memset(&local_6e0,0,0x38);
  local_6c8 = local_4a8;
  local_6b8 = local_5a8;
  local_6b0 = local_6a8;
  memset(local_740,0,0x60);
  local_740[0] = local_74;
  local_740[1] = 0;
  local_740[2] = 0;
  local_730 = 8;
  local_740[3] = 8;
  local_720 = 8;
  get_filemgr_ops();
  fVar3 = filemgr_open(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0
                       ,in_stack_fffffffffffffab8);
  local_758 = fVar3.file;
  local_748 = fVar3.rv;
  local_750 = local_758;
  docio_init(in_stack_fffffffffffff718,in_stack_fffffffffffff710,
             SUB81((ulong)in_stack_fffffffffffff708 >> 0x38,0));
  btreeblk_init((btreeblk_handle *)in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                (uint32_t)((ulong)in_stack_fffffffffffff700 >> 0x20));
  memset(local_198,0,0x100);
  sprintf(local_198,"00000000aaaaaaaabbbbbbbb");
  list_init((list *)&stack0xfffffffffffff770);
  uVar4 = 0;
  do {
    if (7 < uVar4) {
      iVar1 = local_74;
      btreeblk_get_ops();
      log_callback = local_798;
      handle = _readkey_wrap;
      file_00 = (filemgr *)0x8;
      hbtrie_init_and_load
                (in_stack_fffffffffffff740,iVar1,in_stack_fffffffffffff738,
                 (int)((ulong)&stack0xfffffffffffff770 >> 0x20),0x10b1e0,initial_load_get,
                 in_stack_fffffffffffff750,in_stack_fffffffffffff758,
                 (hbtrie_func_readkey *)in_stack_fffffffffffff760,uVar4,
                 (hbtrie_load_get_next_entry *)in_stack_fffffffffffff770,
                 (hbtrie_load_get_kv_from_entry *)in_stack_fffffffffffff778,
                 in_stack_fffffffffffff780,in_stack_fffffffffffff788);
      filemgr_commit(file_00,SUB81((ulong)handle >> 0x38,0),log_callback);
      printf("trie root bid %lu\n",in_stack_fffffffffffff788);
      uVar4 = 0;
      do {
        if (7 < uVar4) {
          hbtrie_free((hbtrie *)0x10d87d);
          docio_free((docio_handle *)0x10d88a);
          btreeblk_free((btreeblk_handle *)file_00);
          filemgr_close(in_stack_fffffffffffffd58,(bool)in_stack_fffffffffffffd57,
                        in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
          filemgr_shutdown();
          local_8b8 = list_begin((list *)&stack0xfffffffffffff770);
          while (local_8b8 != (list_elem *)0x0) {
            plVar2 = list_next(local_8b8);
            free(local_8b8[1].prev);
            free(local_8b8);
            local_8b8 = plVar2;
          }
          if (initial_load_test_incremental_prefix::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","initial load with tailing null test");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","initial load with tailing null test");
          }
          return;
        }
        sprintf(local_298,"metadata_%03zu",uVar4);
        sprintf(local_398,"body_%03zu",uVar4);
        local_39c = hbtrie_find((hbtrie *)&stack0xfffffffffffff780,local_198,(int)uVar4 + 0x10,
                                &stack0xfffffffffffff750);
        btreeblk_end((btreeblk_handle *)handle);
        if (local_39c == HBTRIE_RESULT_FAIL) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                  ,0x5bd);
          initial_load_test_incremental_prefix::__test_pass = 0;
          if (local_39c == HBTRIE_RESULT_FAIL) {
            __assert_fail("r != HBTRIE_RESULT_FAIL",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                          ,0x5bd,"void initial_load_test_incremental_prefix()");
          }
        }
        if (local_39c != HBTRIE_RESULT_FAIL) {
          local_88 = (list_elem *)
                     ((ulong)in_stack_fffffffffffff750 >> 0x38 |
                      ((ulong)in_stack_fffffffffffff750 & 0xff000000000000) >> 0x28 |
                      ((ulong)in_stack_fffffffffffff750 & 0xff0000000000) >> 0x18 |
                      ((ulong)in_stack_fffffffffffff750 & 0xff00000000) >> 8 |
                      ((ulong)in_stack_fffffffffffff750 & 0xff000000) << 8 |
                      ((ulong)in_stack_fffffffffffff750 & 0xff0000) << 0x18 |
                      ((ulong)in_stack_fffffffffffff750 & 0xff00) << 0x28 |
                     (long)in_stack_fffffffffffff750 << 0x38);
          docio_read_doc(in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                         in_stack_fffffffffffff808,(bool)in_stack_fffffffffffff807);
          iVar1 = memcmp(local_6c8,local_198,(ulong)local_6e0);
          if (iVar1 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x5c4);
            initial_load_test_incremental_prefix::__test_pass = 0;
            iVar1 = memcmp(local_6c8,local_198,(ulong)local_6e0);
            if (iVar1 != 0) {
              __assert_fail("!memcmp(doc.key, dockey, doc.length.keylen)",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x5c4,"void initial_load_test_incremental_prefix()");
            }
          }
          iVar1 = memcmp(local_6b8,local_298,(ulong)local_6de);
          if (iVar1 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x5c5);
            initial_load_test_incremental_prefix::__test_pass = 0;
            iVar1 = memcmp(local_6b8,local_298,(ulong)local_6de);
            if (iVar1 != 0) {
              __assert_fail("!memcmp(doc.meta, meta, doc.length.metalen)",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x5c5,"void initial_load_test_incremental_prefix()");
            }
          }
          iVar1 = memcmp(local_6b0,local_398,(ulong)local_6dc);
          if (iVar1 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x5c6);
            initial_load_test_incremental_prefix::__test_pass = 0;
            iVar1 = memcmp(local_6b0,local_398,(ulong)local_6dc);
            if (iVar1 != 0) {
              __assert_fail("!memcmp(doc.body, body, doc.length.bodylen)",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x5c6,"void initial_load_test_incremental_prefix()");
            }
          }
        }
        uVar4 = uVar4 + 1;
      } while( true );
    }
    sprintf(local_298,"metadata_%03zu",uVar4);
    sprintf(local_398,"body_%03zu",uVar4);
    local_8c = _set_doc_bin((docio_object *)in_stack_fffffffffffff710,
                            (char *)in_stack_fffffffffffff708,(size_t)in_stack_fffffffffffff700,
                            (char *)in_stack_fffffffffffff6f8,(char *)0x10d1f2);
    if (local_8c == 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
              ,0x59b);
      initial_load_test_incremental_prefix::__test_pass = 0;
      if (local_8c == 0) {
        __assert_fail("docsize != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x59b,"void initial_load_test_incremental_prefix()");
      }
    }
    local_80 = docio_append_doc(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,'\0','\0');
    local_88 = (list_elem *)
               (local_80 >> 0x38 | (local_80 & 0xff000000000000) >> 0x28 |
                (local_80 & 0xff0000000000) >> 0x18 | (local_80 & 0xff00000000) >> 8 |
                (local_80 & 0xff000000) << 8 | (local_80 & 0xff0000) << 0x18 |
                (local_80 & 0xff00) << 0x28 | local_80 << 0x38);
    in_stack_fffffffffffff760 = (list_elem *)malloc(0x28);
    in_stack_fffffffffffff760[1].next = (list_elem *)(ulong)local_6e0;
    plVar2 = (list_elem *)malloc((size_t)in_stack_fffffffffffff760[1].next);
    in_stack_fffffffffffff760[1].prev = plVar2;
    memcpy(in_stack_fffffffffffff760[1].prev,local_198,(size_t)in_stack_fffffffffffff760[1].next);
    in_stack_fffffffffffff760[2].prev = local_88;
    list_push_back((list *)&stack0xfffffffffffff770,in_stack_fffffffffffff760);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void initial_load_test_incremental_prefix()
{
    TEST_INIT();

    int blocksize = 4096;
    uint64_t offset, _offset;
    uint32_t docsize;
    char dockey[256], meta[256], body[256];
    hbtrie_result r;

    int rr = system(SHELL_DEL " hbtrie_testfile");
    (void)rr;

    char keybuf[256], metabuf[256], bodybuf[256];
    struct docio_object doc;
    memset(&doc, 0, sizeof(struct docio_object));
    doc.key = (void*)keybuf;
    doc.meta = (void*)metabuf;
    doc.body = (void*)bodybuf;

    struct filemgr_config config;
    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 0;
    config.flag = 0x0;
    config.options = FILEMGR_CREATE;
    config.chunksize = sizeof(uint64_t);
    config.num_wal_shards = 8;

    filemgr_open_result result = filemgr_open((char *) "./hbtrie_testfile",
                                              get_filemgr_ops(), &config, NULL);
    struct filemgr *file = result.file;
    struct docio_handle dhandle;
    docio_init(&dhandle, file, false);

    struct btreeblk_handle bhandle;
    btreeblk_init(&bhandle, file, blocksize);

    memset(dockey, 0x0, 256);
    sprintf(dockey, "00000000aaaaaaaabbbbbbbb");

    struct hbtrie trie;

#if 0
    uint64_t offset_old;
    hbtrie_init(&trie, 8, 8, blocksize, BLK_NOT_FOUND,
                (void*)&bhandle, btreeblk_get_ops(), (void*)&dhandle, _readkey_wrap);
#endif
    struct list entries;
    list_init(&entries);
    for (size_t ii = 0; ii < 8; ++ii) {
        sprintf(meta, "metadata_%03zu", ii);
        sprintf(body, "body_%03zu", ii);
        docsize = _set_doc_bin(&doc, dockey, 16 + ii, meta, body);
        TEST_CHK(docsize != 0);
        offset = docio_append_doc(&dhandle, &doc, 0, 0);
        _offset = _endian_encode(offset);

#if 0
        hbtrie_insert(&trie, (void*)dockey, doc.length.keylen,
                      (void*)&_offset, (void*)&offset_old);
        btreeblk_end(&bhandle);
#endif
        struct initial_load_elem* ile =
            (struct initial_load_elem*)malloc(sizeof(struct initial_load_elem));
        ile->keylen = doc.length.keylen;
        ile->key = (uint8_t*)malloc(ile->keylen);
        memcpy(ile->key, dockey, ile->keylen);
        memcpy(ile->value, &_offset, sizeof(_offset));
        list_push_back(&entries, &ile->le);
    }
    hbtrie_init_and_load(&trie, 8, 8, blocksize, BLK_NOT_FOUND,
                         (void*)&bhandle, btreeblk_get_ops(),
                         (void*)&dhandle, _readkey_wrap,
                         8,
                         initial_load_next, initial_load_get, initial_btreeblk_end,
                         &entries);

    filemgr_commit(file, true, NULL);
    DBG("trie root bid %" _F64 "\n", trie.root_bid);

    for (size_t ii = 0; ii < 8; ++ii) {
        sprintf(meta, "metadata_%03zu", ii);
        sprintf(body, "body_%03zu", ii);

        uint8_t valuebuf[8];
        r = hbtrie_find(&trie, (void*)dockey, 16 + ii, (void*)valuebuf);
        btreeblk_end(&bhandle);
        TEST_CHK(r != HBTRIE_RESULT_FAIL);

        if (r != HBTRIE_RESULT_FAIL) {
            memcpy(&_offset, valuebuf, 8);
            _offset = _endian_decode(_offset);
            docio_read_doc(&dhandle, _offset, &doc, true);

            TEST_CHK(!memcmp(doc.key, dockey, doc.length.keylen));
            TEST_CHK(!memcmp(doc.meta, meta, doc.length.metalen));
            TEST_CHK(!memcmp(doc.body, body, doc.length.bodylen));
        }
    }

    hbtrie_free(&trie);
    docio_free(&dhandle);
    btreeblk_free(&bhandle);

    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    struct list_elem* le = list_begin(&entries);
    while (le) {
        struct initial_load_elem* ile =
            _get_entry(le, struct initial_load_elem, le);
        le = list_next(le);
        free(ile->key);
        free(ile);
    }

    TEST_RESULT("initial load with tailing null test");
}